

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

int fsg_model_accept(fsg_model_t *fsg,char *words)

{
  fsg_model_t *pfVar1;
  bitvec_t *pbVar2;
  uint uVar3;
  int iVar4;
  bitvec_t *active;
  bitvec_t *ptr;
  char *pcVar5;
  fsg_arciter_t *itor;
  fsg_link_t *pfVar6;
  char delimfound;
  fsg_model_t *local_58;
  char *word;
  uint local_44;
  char *local_40;
  bitvec_t *local_38;
  
  uVar3 = 0;
  if (words != (char *)0x0 && fsg != (fsg_model_t *)0x0) {
    active = (bitvec_t *)
             __ckd_calloc__((long)((fsg->n_state + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x3c3);
    ptr = (bitvec_t *)
          __ckd_calloc__((long)((fsg->n_state + 0x1f) / 0x20),4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                         ,0x3c4);
    active[fsg->start_state / 0x20] =
         active[fsg->start_state / 0x20] | 1 << ((byte)fsg->start_state & 0x1f);
    local_58 = fsg;
    pcVar5 = __ckd_salloc__(words,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x3c8);
    local_40 = pcVar5;
    while( true ) {
      uVar3 = nextword(pcVar5," \t\r\n\v\f",&word,&delimfound);
      pcVar5 = word;
      pfVar1 = local_58;
      if ((int)uVar3 < 0) break;
      local_44 = uVar3;
      iVar4 = fsg_model_word_id(local_58,word);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x3cf,"word: %s\n",pcVar5);
      apply_closure(local_58,active);
      if (iVar4 < 0) {
        uVar3 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x3d7,"word %s not found!\n",word);
        goto LAB_00106212;
      }
      local_38 = active;
      for (uVar3 = 0; pbVar2 = local_38, (int)uVar3 < local_58->n_state; uVar3 = uVar3 + 1) {
        if ((local_38[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
          for (itor = fsg_model_arcs(local_58,uVar3); itor != (fsg_arciter_t *)0x0;
              itor = fsg_arciter_next(itor)) {
            pfVar6 = fsg_arciter_get(itor);
            if (pfVar6->wid == iVar4) {
              ptr[pfVar6->to_state / 0x20] =
                   ptr[pfVar6->to_state / 0x20] | 1 << ((byte)pfVar6->to_state & 0x1f);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0x3e6,"%s %d -> %d\n",word,(ulong)uVar3,pfVar6->to_state);
            }
          }
        }
      }
      memset(local_38,0,(long)((local_58->n_state + 0x1f) / 0x20) << 2);
      word[local_44] = delimfound;
      pcVar5 = word + local_44;
      active = ptr;
      ptr = pbVar2;
    }
    apply_closure(local_58,active);
    uVar3 = (uint)((active[pfVar1->final_state / 0x20] >> (pfVar1->final_state & 0x1fU) & 1) != 0);
LAB_00106212:
    ckd_free(active);
    ckd_free(ptr);
    ckd_free(local_40);
  }
  return uVar3;
}

Assistant:

int
fsg_model_accept(fsg_model_t *fsg, char const *words)
{
    char *ptr, *mutable_words, *word, delimfound;
    bitvec_t *active, *next;
    int n, found = 0;

    if (fsg == NULL || words == NULL)
        return 0;

    active = bitvec_alloc(fsg_model_n_state(fsg));
    next = bitvec_alloc(fsg_model_n_state(fsg));
    bitvec_set(active, fsg_model_start_state(fsg));

    /* For each input word */
    ptr = mutable_words = ckd_salloc(words);
    while ((n = nextword(ptr, " \t\r\n\v\f",
                         &word, &delimfound)) >= 0) {
        int wid = fsg_model_word_id(fsg, word);
        int state;
        bitvec_t *tmp;

        E_INFO("word: %s\n", word);
        /* Expand using previously calculated closure. */
        apply_closure(fsg, active);

        /* Consume the current word, following all non-epsilon
         * transitions possible. */
        if (wid < 0) {
            /* Immediate fail */
            E_INFO("word %s not found!\n", word);
            goto done;
        }
        /* Again, my apologies, this is a bit slow. */
        for (state = 0; state < fsg_model_n_state(fsg); ++state) {
            fsg_arciter_t *itor;
            if (!bitvec_is_set(active, state))
                continue;
            for (itor = fsg_model_arcs(fsg, state);
                 itor != NULL; itor = fsg_arciter_next(itor)) {
                fsg_link_t *link = fsg_arciter_get(itor);
                /* Ignore epsilons, we already did them. */
                if (link->wid == wid) {
                    bitvec_set(next, link->to_state);
                    E_INFO("%s %d -> %d\n",
                           word, state, link->to_state);
                }
            }
        }

        /* Update active list. */
        tmp = active;
        active = next;
        next = tmp;
        bitvec_clear_all(next, fsg_model_n_state(fsg));
        
        word[n] = delimfound;
        ptr = word + n;
    }
    /* Did we reach the final state? First expand any epsilons, then
     * we'll find out! */
    apply_closure(fsg, active);
    found = bitvec_is_set(active, fsg_model_final_state(fsg));

done:
    bitvec_free(active);
    bitvec_free(next);
    ckd_free(mutable_words);
    return found != 0;
}